

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketConnection.cpp
# Opt level: O1

ssize_t __thiscall
FIX::ThreadedSocketConnection::send
          (ThreadedSocketConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  size_t length;
  ssize_t in_RAX;
  int iVar1;
  int iVar2;
  undefined4 in_register_00000034;
  int iVar3;
  
  iVar2 = 0;
  do {
    iVar1 = iVar2;
    length = ((long *)CONCAT44(in_register_00000034,__fd))[1];
    iVar3 = (int)length;
    if (iVar3 <= iVar1) break;
    in_RAX = socket_send(this->m_socket,
                         (char *)((long)iVar1 + *(long *)CONCAT44(in_register_00000034,__fd)),length
                        );
    iVar2 = 0;
    if (-1 < in_RAX) {
      iVar2 = (int)in_RAX;
    }
    iVar2 = iVar2 + iVar1;
  } while (-1 < in_RAX);
  return CONCAT71((int7)((ulong)in_RAX >> 8),iVar3 <= iVar1);
}

Assistant:

bool ThreadedSocketConnection::send( const std::string& msg )
{
  int totalSent = 0;
  while(totalSent < (int)msg.length())
  {
    ssize_t sent = socket_send( m_socket, msg.c_str() + totalSent, msg.length() );
    if(sent < 0) return false;
    totalSent += sent;
  }

  return true;
}